

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_update_servers.c
# Opt level: O2

ares_status_t
ares_sconfig_append_fromstr
          (ares_channel_t *channel,ares_llist_t **sconfig,char *str,ares_bool_t ignore_invalid)

{
  ares_buf_t *buf;
  unsigned_short uVar1;
  ares_status_t aVar2;
  ares_bool_t aVar3;
  int iVar4;
  size_t sVar5;
  ares_buf_t *buf_00;
  undefined8 *puVar6;
  char *pcVar7;
  void *pvVar8;
  size_t sVar9;
  long lVar10;
  size_t idx;
  uchar *puVar11;
  uchar *puVar12;
  byte bVar13;
  size_t sStack_1e0;
  ares_array_t *list;
  ares_bool_t local_1cc;
  ares_sconfig_t s;
  size_t addrlen;
  ares_uri_t *uri;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined6 uStack_150;
  undefined2 local_14a;
  undefined6 uStack_148;
  undefined8 uStack_142;
  char hoststr [256];
  
  bVar13 = 0;
  list = (ares_array_t *)0x0;
  local_1cc = ignore_invalid;
  sVar5 = ares_strlen(str);
  buf_00 = ares_buf_create_const((uchar *)str,sVar5);
  if (buf_00 == (ares_buf_t *)0x0) {
    aVar2 = ARES_ENOMEM;
  }
  else {
    aVar2 = ares_buf_split(buf_00,(uchar *)" ,",2,ARES_BUF_SPLIT_NONE,0,&list);
    if (aVar2 == ARES_SUCCESS) {
      sVar5 = ares_array_len(list);
      for (idx = 0; sVar5 != idx; idx = idx + 1) {
        puVar6 = (undefined8 *)ares_array_at(list,idx);
        buf = (ares_buf_t *)*puVar6;
        uri = (ares_uri_t *)0x0;
        aVar2 = ares_uri_parse_buf(&uri,buf);
        if (aVar2 == ARES_SUCCESS) {
          pcVar7 = ares_uri_get_scheme(uri);
          aVar3 = ares_streq("dns",pcVar7);
          if (aVar3 == ARES_FALSE) {
LAB_00117c6e:
            ares_uri_destroy(uri);
            goto LAB_00117c78;
          }
          pcVar7 = ares_uri_get_host(uri);
          ares_strcpy(hoststr,pcVar7,0x100);
          pcVar7 = strchr(hoststr,0x25);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
            ares_strcpy(s.ll_iface,pcVar7 + 1,0x10);
          }
          s.addr._0_8_ = s.addr._0_8_ & 0xffffffff00000000;
          pvVar8 = ares_dns_pton(hoststr,&s.addr,&addrlen);
          if (pvVar8 == (void *)0x0) goto LAB_00117c6e;
          uVar1 = ares_uri_get_port(uri);
          s.tcp_port = uVar1;
          s.udp_port = uVar1;
          pcVar7 = ares_uri_get_query_key(uri,"tcpport");
          if (pcVar7 != (char *)0x0) {
            iVar4 = atoi(pcVar7);
            s.tcp_port = (unsigned_short)iVar4;
          }
          ares_uri_destroy(uri);
LAB_00117c3d:
          aVar2 = ares_sconfig_append(channel,sconfig,&s.addr,s.udp_port,s.tcp_port,s.ll_iface);
          if (aVar2 != ARES_SUCCESS) goto LAB_00117f2b;
        }
        else {
LAB_00117c78:
          uStack_148 = 0;
          uStack_142 = 0;
          uStack_158 = 0;
          uStack_150 = 0;
          local_14a = 0;
          uri = (ares_uri_t *)0x0;
          uStack_160 = 0;
          s.addr._0_8_ = 0;
          s.addr.addr._4_8_ = 0;
          s._16_8_ = 0;
          s.ll_iface[0] = '\0';
          s.ll_iface[1] = '\0';
          s.ll_iface[2] = '\0';
          s.ll_iface[3] = '\0';
          s.ll_iface[4] = '\0';
          s.ll_iface[5] = '\0';
          s.ll_iface[6] = '\0';
          s.ll_iface[7] = '\0';
          s.ll_iface[8] = '\0';
          s.ll_iface[9] = '\0';
          s.ll_iface[10] = '\0';
          s.ll_iface[0xb] = '\0';
          s.ll_iface[0xc] = '\0';
          s.ll_iface[0xd] = '\0';
          s.ll_iface[0xe] = '\0';
          s.ll_iface[0xf] = '\0';
          s.ll_scope = 0;
          ares_buf_consume_whitespace(buf,ARES_TRUE);
          aVar3 = ares_buf_begins_with(buf,(uchar *)"[",1);
          if (aVar3 == ARES_FALSE) {
            ares_buf_tag(buf);
            sVar9 = ares_buf_consume_until_charset(buf,".",1,ARES_TRUE);
            ares_buf_tag_rollback(buf);
            ares_buf_tag(buf);
            if (sVar9 - 1 < 3) {
              pcVar7 = "0123456789.";
              sStack_1e0 = 0xb;
            }
            else {
              builtin_strncpy(hoststr + 0x10,"456789.:",9);
              builtin_strncpy(hoststr,"ABCDEFabcdef0123",0x10);
              pcVar7 = hoststr;
              sStack_1e0 = 0x18;
            }
            sVar9 = ares_buf_consume_charset(buf,(uchar *)pcVar7,sStack_1e0);
            aVar2 = ARES_EBADSTR;
            if ((sVar9 != 0) &&
               (aVar2 = ares_buf_tag_fetch_string(buf,(char *)&uri,0x2e), aVar2 == ARES_SUCCESS))
            goto LAB_00117dc5;
          }
          else {
            ares_buf_consume(buf,1);
            ares_buf_tag(buf);
            sVar9 = ares_buf_consume_until_charset(buf,(uchar *)"]",1,ARES_TRUE);
            aVar2 = ARES_EBADSTR;
            if ((sVar9 != 0xffffffffffffffff) &&
               (aVar2 = ares_buf_tag_fetch_string(buf,(char *)&uri,0x2e), aVar2 == ARES_SUCCESS)) {
              ares_buf_consume(buf,1);
LAB_00117dc5:
              s.addr._0_8_ = s.addr._0_8_ & 0xffffffff00000000;
              pvVar8 = ares_dns_pton((char *)&uri,&s.addr,&addrlen);
              aVar2 = ARES_EBADSTR;
              if (pvVar8 != (void *)0x0) {
                aVar3 = ares_buf_begins_with(buf,(uchar *)":",1);
                if (aVar3 != ARES_FALSE) {
                  ares_buf_consume(buf,1);
                  ares_buf_tag(buf);
                  sVar9 = ares_buf_consume_charset(buf,(uchar *)"0123456789",10);
                  aVar2 = ARES_EBADSTR;
                  if ((sVar9 == 0) ||
                     (aVar2 = ares_buf_tag_fetch_string(buf,hoststr,6), aVar2 != ARES_SUCCESS))
                  goto LAB_00117f04;
                  iVar4 = atoi(hoststr);
                  s.tcp_port = (unsigned_short)iVar4;
                  s.udp_port = (unsigned_short)iVar4;
                }
                aVar3 = ares_buf_begins_with(buf,(uchar *)"%",1);
                if (aVar3 == ARES_FALSE) {
LAB_00117eda:
                  ares_buf_consume_whitespace(buf,ARES_TRUE);
                  sVar9 = ares_buf_len(buf);
                  aVar2 = ARES_EBADSTR;
                  if (sVar9 == 0) goto LAB_00117c3d;
                }
                else {
                  puVar11 = (uchar *)
                            "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789.-_\\:{}"
                  ;
                  puVar12 = (uchar *)hoststr;
                  for (lVar10 = 0x46; lVar10 != 0; lVar10 = lVar10 + -1) {
                    *puVar12 = *puVar11;
                    puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
                    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
                  }
                  ares_buf_consume(buf,1);
                  ares_buf_tag(buf);
                  sVar9 = ares_buf_consume_charset(buf,(uchar *)hoststr,0x45);
                  if (sVar9 == 0) {
                    aVar2 = ARES_EBADSTR;
                  }
                  else {
                    aVar2 = ares_buf_tag_fetch_string(buf,s.ll_iface,0x10);
                    if (aVar2 == ARES_SUCCESS) goto LAB_00117eda;
                  }
                }
              }
            }
          }
LAB_00117f04:
          if (local_1cc == ARES_FALSE) goto LAB_00117f2b;
        }
      }
      aVar2 = ARES_SUCCESS;
    }
  }
LAB_00117f2b:
  ares_array_destroy(list);
  ares_buf_destroy(buf_00);
  return aVar2;
}

Assistant:

ares_status_t ares_sconfig_append_fromstr(const ares_channel_t *channel,
                                          ares_llist_t        **sconfig,
                                          const char           *str,
                                          ares_bool_t           ignore_invalid)
{
  ares_status_t status = ARES_SUCCESS;
  ares_buf_t   *buf    = NULL;
  ares_array_t *list   = NULL;
  size_t        num;
  size_t        i;

  /* On Windows, there may be more than one nameserver specified in the same
   * registry key, so we parse input as a space or comma separated list.
   */
  buf = ares_buf_create_const((const unsigned char *)str, ares_strlen(str));
  if (buf == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  status = ares_buf_split(buf, (const unsigned char *)" ,", 2,
                          ARES_BUF_SPLIT_NONE, 0, &list);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  num = ares_array_len(list);
  for (i = 0; i < num; i++) {
    ares_buf_t   **bufptr = ares_array_at(list, i);
    ares_buf_t    *entry  = *bufptr;
    ares_sconfig_t s;

    status = parse_nameserver_uri(entry, &s);
    if (status != ARES_SUCCESS) {
      status = parse_nameserver(entry, &s);
    }

    if (status != ARES_SUCCESS) {
      if (ignore_invalid) {
        continue;
      } else {
        goto done;
      }
    }

    status = ares_sconfig_append(channel, sconfig, &s.addr, s.udp_port,
                                 s.tcp_port, s.ll_iface);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(list);
  ares_buf_destroy(buf);
  return status;
}